

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

_Bool array_container_is_subset_run(array_container_t *container1,run_container_t *container2)

{
  ushort uVar1;
  ushort uVar2;
  uint uVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  uint uVar8;
  
  iVar6 = container1->cardinality;
  uVar3 = croaring_hardware_support();
  if ((uVar3 & 2) == 0) {
    uVar3 = croaring_hardware_support();
    if ((uVar3 & 1) == 0) {
      iVar5 = container2->n_runs;
      lVar4 = (long)iVar5;
      if (0 < lVar4) {
        lVar7 = 0;
        do {
          iVar5 = iVar5 + (uint)container2->runs[lVar7].length;
          lVar7 = lVar7 + 1;
        } while (lVar4 != lVar7);
      }
    }
    else {
      iVar5 = _avx2_run_container_cardinality(container2);
    }
  }
  else {
    iVar5 = _avx512_run_container_cardinality(container2);
  }
  uVar3 = 0;
  if (iVar6 <= iVar5) {
    iVar6 = 0;
    for (; (iVar6 < container1->cardinality && ((int)uVar3 < container2->n_runs));
        uVar3 = uVar3 + (uVar8 < uVar2)) {
      uVar1 = container2->runs[(int)uVar3].value;
      uVar2 = container1->array[iVar6];
      if (uVar2 < uVar1) {
        uVar3 = 0;
        goto LAB_001156ab;
      }
      uVar8 = (uint)container2->runs[(int)uVar3].length + (uint)uVar1;
      iVar6 = (iVar6 + 1) - (uint)(uVar8 < uVar2);
    }
    uVar3 = (uint)(iVar6 == container1->cardinality);
  }
LAB_001156ab:
  return SUB41(uVar3,0);
}

Assistant:

bool array_container_is_subset_run(const array_container_t* container1,
                                   const run_container_t* container2) {
    if (container1->cardinality > run_container_cardinality(container2))
        return false;
    int i_array = 0, i_run = 0;
    while (i_array < container1->cardinality && i_run < container2->n_runs) {
        uint32_t start = container2->runs[i_run].value;
        uint32_t stop = start + container2->runs[i_run].length;
        if (container1->array[i_array] < start) {
            return false;
        } else if (container1->array[i_array] > stop) {
            i_run++;
        } else {  // the value of the array is in the run
            i_array++;
        }
    }
    if (i_array == container1->cardinality) {
        return true;
    } else {
        return false;
    }
}